

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O1

convert_status __thiscall
crunch::display_file_info(crunch *this,uint32 file_index,uint32 num_files,char *pSrc_filename)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  format file_format;
  texture_type t;
  param_map_const_iterator pVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  crn_texture_info *pInfo;
  uint uVar9;
  convert_status cVar10;
  uint uVar11;
  uint uVar12;
  uint local_e0;
  uint local_dc;
  vector<unsigned_char> src_tex_bytes;
  lzma_codec lossless_codec;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  undefined8 local_a0;
  vector<unsigned_char> cmp_tex_bytes;
  uint64 input_file_size;
  mipmapped_texture src_tex;
  
  if (num_files < 2) {
    crnlib::console::message("Source texture: \"%s\"",pSrc_filename);
  }
  else {
    crnlib::console::message("[%u/%u] Source texture: \"%s\"",(ulong)(file_index + 1));
  }
  file_format = crnlib::texture_file_types::determine_file_format(pSrc_filename);
  if (file_format == cFormatInvalid) {
    cVar10 = cCSFailed;
    crnlib::console::error("Unrecognized file type: %s",pSrc_filename);
  }
  else {
    crnlib::mipmapped_texture::mipmapped_texture(&src_tex);
    bVar2 = crnlib::mipmapped_texture::read_from_file(&src_tex,pSrc_filename,file_format);
    if (bVar2) {
      crnlib::file_utils::get_file_size(pSrc_filename,&input_file_size);
      uVar9 = 0;
      uVar8 = 0;
      while( true ) {
        uVar11 = 0;
        if (src_tex.m_faces.m_size != 0) {
          uVar11 = (src_tex.m_faces.m_p)->m_size;
        }
        if (uVar11 <= uVar8) break;
        uVar11 = src_tex.m_width >> ((byte)uVar8 & 0x1f);
        uVar12 = src_tex.m_height >> ((byte)uVar8 & 0x1f);
        uVar9 = uVar9 + (uVar11 + (uVar11 == 0)) * src_tex.m_faces.m_size * (uVar12 + (uVar12 == 0))
        ;
        uVar8 = uVar8 + 1;
      }
      src_tex_bytes.m_p = (uchar *)0x0;
      src_tex_bytes.m_size = 0;
      src_tex_bytes.m_capacity = 0;
      bVar2 = crnlib::cfile_stream::read_file_into_array(pSrc_filename,&src_tex_bytes);
      if (bVar2) {
        if (src_tex_bytes.m_size == 0) {
          cVar10 = cCSSkipped;
          crnlib::console::warning("Source file is empty: %s",pSrc_filename);
        }
        else {
          local_dc = 0;
          pVar5 = crnlib::command_line_params::get_param(&this->m_params,"lzmastats",0);
          if ((_Rb_tree_header *)pVar5._M_node !=
              &(this->m_params).m_param_map._M_t._M_impl.super__Rb_tree_header) {
            crnlib::lzma_codec::lzma_codec(&lossless_codec);
            cmp_tex_bytes.m_p = (uchar *)0x0;
            cmp_tex_bytes.m_size = 0;
            cmp_tex_bytes.m_capacity = 0;
            bVar2 = crnlib::lzma_codec::pack
                              (&lossless_codec,src_tex_bytes.m_p,src_tex_bytes.m_size,&cmp_tex_bytes
                              );
            local_dc = 0;
            if (bVar2) {
              local_dc = cmp_tex_bytes.m_size;
            }
            if (cmp_tex_bytes.m_p != (uchar *)0x0) {
              crnlib::crnlib_free(cmp_tex_bytes.m_p);
            }
            crnlib::lzma_codec::~lzma_codec(&lossless_codec);
          }
          if (src_tex.m_faces.m_size == 0) {
            local_e0 = 0;
          }
          else {
            local_e0 = (src_tex.m_faces.m_p)->m_size;
          }
          pcVar6 = crnlib::pixel_format_helpers::get_pixel_format_string(src_tex.m_format);
          bVar2 = crnlib::mipmapped_texture::is_packed(&src_tex);
          t = crnlib::mipmapped_texture::determine_texture_type(&src_tex);
          pcVar7 = crnlib::get_texture_type_desc(t);
          bVar3 = crnlib::mipmapped_texture::is_flipped(&src_tex);
          bVar4 = crnlib::mipmapped_texture::can_unflip_without_unpacking(&src_tex);
          pInfo = (crn_texture_info *)(ulong)local_e0;
          crnlib::console::info
                    ("Source texture dimensions: %ux%u, Levels: %u, Faces: %u, Format: %s\nPacked Format: %u, Apparent Type: %s, Flipped: %u, Can Unflip Without Unpacking: %u"
                     ,(ulong)src_tex.m_width,(ulong)src_tex.m_height,pInfo,
                     (ulong)src_tex.m_faces.m_size,pcVar6,(ulong)bVar2,pcVar7,(ulong)bVar3,
                     (ulong)bVar4);
          if ((long)input_file_size < 0) {
            pInfo = (crn_texture_info *)((ulong)((uint)input_file_size & 1) | input_file_size >> 1);
          }
          crnlib::console::info
                    ("Total pixels: %u, Source file size: %llu, Source file bits/pixel: %1.3f",
                     SUB84((double)(((float)input_file_size * 8.0) / (float)uVar9),0),(ulong)uVar9);
          if (local_dc != 0) {
            crnlib::console::info
                      ("LZMA compressed file size: %u bytes, %1.3f bits/pixel",
                       SUB84((double)(((float)local_dc * 8.0) / (float)uVar9),0));
          }
          dVar1 = crnlib::math::compute_entropy(src_tex_bytes.m_p,src_tex_bytes.m_size);
          crnlib::console::info
                    ("Source file entropy: %3.6f bits per byte",
                     SUB84(dVar1 / (double)(src_tex_bytes._8_8_ & 0xffffffff),0));
          cVar10 = cCSSucceeded;
          if (file_format == cFormatCRN) {
            lossless_codec.m_pCompress._0_4_ = 0x28;
            bVar2 = crnd::crnd_get_texture_info
                              ((crnd *)src_tex_bytes.m_p,(void *)(src_tex_bytes._8_8_ & 0xffffffff),
                               (uint32)&lossless_codec,pInfo);
            if (bVar2) {
              crnlib::console::info("CRN texture info:");
              crnlib::console::info
                        ("Width: %u, Height: %u, Levels: %u, Faces: %u\nBytes per block: %u, User0: 0x%08X, User1: 0x%08X, CRN Format: %u"
                         ,(ulong)lossless_codec.m_pCompress._4_4_,
                         (ulong)(uint)lossless_codec.m_pUncompress,
                         (ulong)lossless_codec.m_pUncompress._4_4_,(ulong)local_b0,(ulong)local_ac,
                         (ulong)local_a8,(ulong)local_a4,local_a0);
            }
            else {
              crnlib::console::error("Failed retrieving CRN texture info!");
            }
          }
        }
      }
      else {
        cVar10 = cCSFailed;
        crnlib::console::error("Failed loading source file: %s",pSrc_filename);
      }
      if (src_tex_bytes.m_p != (uchar *)0x0) {
        crnlib::crnlib_free(src_tex_bytes.m_p);
      }
    }
    else if (src_tex.m_last_error.m_len == 0) {
      cVar10 = cCSFailed;
      crnlib::console::error("Failed reading source file: \"%s\"",pSrc_filename);
    }
    else {
      pcVar6 = "";
      if (src_tex.m_last_error.m_pStr != (char *)0x0) {
        pcVar6 = src_tex.m_last_error.m_pStr;
      }
      cVar10 = cCSFailed;
      crnlib::console::error("%s",pcVar6);
    }
    crnlib::mipmapped_texture::~mipmapped_texture(&src_tex);
  }
  return cVar10;
}

Assistant:

convert_status display_file_info(uint32 file_index, uint32 num_files, const char* pSrc_filename)
    {
        if (num_files > 1)
        {
            console::message("[%u/%u] Source texture: \"%s\"", file_index + 1, num_files, pSrc_filename);
        }
        else
        {
            console::message("Source texture: \"%s\"", pSrc_filename);
        }

        texture_file_types::format src_file_format = texture_file_types::determine_file_format(pSrc_filename);
        if (src_file_format == texture_file_types::cFormatInvalid)
        {
            console::error("Unrecognized file type: %s", pSrc_filename);
            return cCSFailed;
        }

        mipmapped_texture src_tex;
        if (!src_tex.read_from_file(pSrc_filename, src_file_format))
        {
            if (src_tex.get_last_error().is_empty())
            {
                console::error("Failed reading source file: \"%s\"", pSrc_filename);
            }
            else
            {
                console::error("%s", src_tex.get_last_error().get_ptr());
            }

            return cCSFailed;
        }

        uint64 input_file_size;
        file_utils::get_file_size(pSrc_filename, input_file_size);

        uint32 total_in_pixels = 0;
        for (uint32 i = 0; i < src_tex.get_num_levels(); i++)
        {
            uint32 width = math::maximum<uint32>(1, src_tex.get_width() >> i);
            uint32 height = math::maximum<uint32>(1, src_tex.get_height() >> i);
            total_in_pixels += width * height * src_tex.get_num_faces();
        }

        vector<uint8> src_tex_bytes;
        if (!cfile_stream::read_file_into_array(pSrc_filename, src_tex_bytes))
        {
            console::error("Failed loading source file: %s", pSrc_filename);
            return cCSFailed;
        }

        if (!src_tex_bytes.size())
        {
            console::warning("Source file is empty: %s", pSrc_filename);
            return cCSSkipped;
        }

        uint32 compressed_size = 0;
        if (m_params.has_key("lzmastats"))
        {
            lzma_codec lossless_codec;
            vector<uint8> cmp_tex_bytes;
            if (lossless_codec.pack(src_tex_bytes.get_ptr(), src_tex_bytes.size(), cmp_tex_bytes))
            {
                compressed_size = cmp_tex_bytes.size();
            }
        }
        console::info("Source texture dimensions: %ux%u, Levels: %u, Faces: %u, Format: %s\nPacked Format: %u, Apparent Type: %s, Flipped: %u, Can Unflip Without Unpacking: %u",
            src_tex.get_width(),
            src_tex.get_height(),
            src_tex.get_num_levels(),
            src_tex.get_num_faces(),
            pixel_format_helpers::get_pixel_format_string(src_tex.get_format()),
            src_tex.is_packed(), get_texture_type_desc(src_tex.determine_texture_type()),
            src_tex.is_flipped(), src_tex.can_unflip_without_unpacking());

        console::info("Total pixels: %u, Source file size: " CRNLIB_UINT64_FORMAT_SPECIFIER ", Source file bits/pixel: %1.3f",
            total_in_pixels, input_file_size, (input_file_size * 8.0f) / total_in_pixels);
        if (compressed_size)
        {
            console::info("LZMA compressed file size: %u bytes, %1.3f bits/pixel",
                compressed_size, compressed_size * 8.0f / total_in_pixels);
        }

        double entropy = math::compute_entropy(src_tex_bytes.get_ptr(), src_tex_bytes.size());
        console::info("Source file entropy: %3.6f bits per byte", entropy / src_tex_bytes.size());

        if (src_file_format == texture_file_types::cFormatCRN)
        {
            crnd::crn_texture_info tex_info;
            tex_info.m_struct_size = sizeof(crnd::crn_texture_info);
            crn_bool success = crnd::crnd_get_texture_info(src_tex_bytes.get_ptr(), src_tex_bytes.size(), &tex_info);
            if (!success)
            {
                console::error("Failed retrieving CRN texture info!");
            }
            else
            {
                console::info("CRN texture info:");

                console::info("Width: %u, Height: %u, Levels: %u, Faces: %u\nBytes per block: %u, User0: 0x%08X, User1: 0x%08X, CRN Format: %u",
                    tex_info.m_width,
                    tex_info.m_height,
                    tex_info.m_levels,
                    tex_info.m_faces,
                    tex_info.m_bytes_per_block,
                    tex_info.m_userdata0,
                    tex_info.m_userdata1,
                    tex_info.m_format);
            }
        }

        return cCSSucceeded;
    }